

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

void GetNodeTransform(aiMatrix4x4 *matrix,Node *node)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  if ((node->matrix).isPresent == true) {
    matrix->a1 = (node->matrix).value[0];
    matrix->b1 = (node->matrix).value[1];
    matrix->c1 = (node->matrix).value[2];
    matrix->d1 = (node->matrix).value[3];
    matrix->a2 = (node->matrix).value[4];
    matrix->b2 = (node->matrix).value[5];
    matrix->c2 = (node->matrix).value[6];
    matrix->d2 = (node->matrix).value[7];
    matrix->a3 = (node->matrix).value[8];
    matrix->b3 = (node->matrix).value[9];
    matrix->c3 = (node->matrix).value[10];
    matrix->d3 = (node->matrix).value[0xb];
    matrix->a4 = (node->matrix).value[0xc];
    matrix->b4 = (node->matrix).value[0xd];
    matrix->c4 = (node->matrix).value[0xe];
    fVar16 = (node->matrix).value[0xf];
  }
  else {
    if ((node->translation).isPresent == true) {
      fVar16 = (node->translation).value[0];
      fVar1 = (node->translation).value[1];
      fVar2 = (node->translation).value[2];
      fVar3 = matrix->a1;
      fVar17 = matrix->a2;
      fVar9 = matrix->a3;
      fVar10 = matrix->b1;
      fVar11 = matrix->b2;
      fVar12 = matrix->b3;
      fVar20 = matrix->a4 * 0.0;
      fVar13 = matrix->c1;
      fVar14 = matrix->c2;
      fVar23 = matrix->b4 * 0.0;
      fVar15 = matrix->c3;
      fVar4 = matrix->c4 * 0.0;
      fVar6 = matrix->d2;
      fVar7 = matrix->d1;
      fVar8 = matrix->d3;
      fVar5 = matrix->d4 * 0.0;
      matrix->a1 = fVar3 + fVar17 * 0.0 + fVar9 * 0.0 + fVar20;
      matrix->a2 = fVar3 * 0.0 + fVar17 + fVar9 * 0.0 + fVar20;
      matrix->a3 = fVar3 * 0.0 + fVar17 * 0.0 + fVar9 + fVar20;
      matrix->a4 = fVar9 * fVar2 + fVar17 * fVar1 + fVar16 * fVar3 + matrix->a4;
      matrix->b1 = fVar10 + fVar11 * 0.0 + fVar12 * 0.0 + fVar23;
      matrix->b2 = fVar10 * 0.0 + fVar11 + fVar12 * 0.0 + fVar23;
      matrix->b3 = fVar10 * 0.0 + fVar11 * 0.0 + fVar12 + fVar23;
      matrix->b4 = fVar12 * fVar2 + fVar11 * fVar1 + fVar16 * fVar10 + matrix->b4;
      matrix->c1 = fVar13 + fVar14 * 0.0 + fVar15 * 0.0 + fVar4;
      matrix->c2 = fVar13 * 0.0 + fVar14 + fVar15 * 0.0 + fVar4;
      matrix->c3 = fVar13 * 0.0 + fVar14 * 0.0 + fVar15 + fVar4;
      matrix->c4 = fVar15 * fVar2 + fVar14 * fVar1 + fVar16 * fVar13 + matrix->c4;
      matrix->d1 = fVar7 + fVar6 * 0.0 + fVar8 * 0.0 + fVar5;
      matrix->d2 = fVar7 * 0.0 + fVar6 + fVar8 * 0.0 + fVar5;
      matrix->d3 = fVar7 * 0.0 + fVar6 * 0.0 + fVar8 + fVar5;
      matrix->d4 = fVar2 * fVar8 + fVar16 * fVar7 + fVar1 * fVar6 + matrix->d4;
    }
    if ((node->rotation).isPresent == true) {
      fVar16 = (node->rotation).value[0];
      fVar1 = (node->rotation).value[1];
      fVar2 = (node->rotation).value[2];
      fVar3 = (node->rotation).value[3];
      fVar17 = fVar1 * fVar1 + fVar2 * fVar2;
      fVar19 = 1.0 - (fVar17 + fVar17);
      fVar23 = fVar16 * fVar1 - fVar2 * fVar3;
      fVar23 = fVar23 + fVar23;
      fVar21 = fVar16 * fVar2 + fVar1 * fVar3;
      fVar21 = fVar21 + fVar21;
      fVar20 = fVar2 * fVar3 + fVar16 * fVar1;
      fVar20 = fVar20 + fVar20;
      fVar17 = fVar2 * fVar2 + fVar16 * fVar16;
      fVar18 = 1.0 - (fVar17 + fVar17);
      fVar5 = fVar1 * fVar2 - fVar16 * fVar3;
      fVar5 = fVar5 + fVar5;
      fVar24 = fVar16 * fVar2 - fVar1 * fVar3;
      fVar24 = fVar24 + fVar24;
      fVar22 = fVar16 * fVar3 + fVar1 * fVar2;
      fVar22 = fVar22 + fVar22;
      fVar16 = fVar16 * fVar16 + fVar1 * fVar1;
      fVar25 = 1.0 - (fVar16 + fVar16);
      fVar16 = matrix->a1;
      fVar1 = matrix->a2;
      fVar2 = matrix->a3;
      fVar3 = matrix->b2;
      fVar4 = matrix->a4 * 0.0;
      fVar17 = matrix->b1;
      fVar9 = matrix->b3;
      fVar6 = matrix->b4 * 0.0;
      fVar10 = matrix->c2;
      fVar11 = matrix->c1;
      fVar12 = matrix->c3;
      fVar7 = matrix->c4 * 0.0;
      fVar13 = matrix->d2;
      fVar14 = matrix->d1;
      fVar15 = matrix->d3;
      fVar8 = matrix->d4 * 0.0;
      matrix->a1 = fVar24 * fVar2 + fVar19 * fVar16 + fVar1 * fVar20 + fVar4;
      matrix->a2 = fVar22 * fVar2 + fVar23 * fVar16 + fVar1 * fVar18 + fVar4;
      matrix->a3 = fVar25 * fVar2 + fVar21 * fVar16 + fVar1 * fVar5 + fVar4;
      matrix->a4 = fVar2 * 0.0 + fVar16 * 0.0 + fVar1 * 0.0 + matrix->a4;
      matrix->b1 = fVar24 * fVar9 + fVar19 * fVar17 + fVar20 * fVar3 + fVar6;
      matrix->b2 = fVar22 * fVar9 + fVar23 * fVar17 + fVar18 * fVar3 + fVar6;
      matrix->b3 = fVar25 * fVar9 + fVar21 * fVar17 + fVar5 * fVar3 + fVar6;
      matrix->b4 = fVar9 * 0.0 + fVar17 * 0.0 + fVar3 * 0.0 + matrix->b4;
      matrix->c1 = fVar24 * fVar12 + fVar19 * fVar11 + fVar20 * fVar10 + fVar7;
      matrix->c2 = fVar22 * fVar12 + fVar23 * fVar11 + fVar18 * fVar10 + fVar7;
      matrix->c3 = fVar25 * fVar12 + fVar21 * fVar11 + fVar5 * fVar10 + fVar7;
      matrix->c4 = fVar12 * 0.0 + fVar11 * 0.0 + fVar10 * 0.0 + matrix->c4;
      matrix->d1 = fVar24 * fVar15 + fVar19 * fVar14 + fVar20 * fVar13 + fVar8;
      matrix->d2 = fVar22 * fVar15 + fVar23 * fVar14 + fVar18 * fVar13 + fVar8;
      matrix->d3 = fVar25 * fVar15 + fVar21 * fVar14 + fVar5 * fVar13 + fVar8;
      matrix->d4 = fVar15 * 0.0 + fVar14 * 0.0 + fVar13 * 0.0 + matrix->d4;
    }
    if ((node->scale).isPresent != true) {
      return;
    }
    fVar1 = (node->scale).value[0];
    fVar2 = (node->scale).value[1];
    fVar3 = (node->scale).value[2];
    fVar23 = matrix->a2 * 0.0;
    fVar5 = matrix->a1 * 0.0;
    fVar20 = fVar5 + fVar23;
    fVar17 = matrix->a3 * 0.0;
    fVar18 = matrix->a4 * 0.0;
    fVar21 = matrix->b2 * 0.0;
    fVar6 = matrix->b1 * 0.0;
    fVar7 = fVar6 + fVar21;
    fVar22 = matrix->b3 * 0.0;
    fVar24 = matrix->b4 * 0.0;
    fVar19 = matrix->c2 * 0.0;
    fVar8 = matrix->c1 * 0.0;
    fVar4 = fVar8 + fVar19;
    fVar9 = matrix->c3 * 0.0;
    fVar10 = matrix->c4 * 0.0;
    fVar13 = matrix->d2 * 0.0;
    fVar11 = matrix->d1 * 0.0;
    fVar12 = fVar11 + fVar13;
    fVar14 = matrix->d3 * 0.0;
    fVar16 = fVar12 + fVar14 + matrix->d4;
    fVar15 = matrix->d4 * 0.0;
    matrix->a1 = fVar1 * matrix->a1 + fVar23 + fVar17 + fVar18;
    matrix->a2 = fVar2 * matrix->a2 + fVar5 + fVar17 + fVar18;
    matrix->a3 = fVar3 * matrix->a3 + fVar20 + fVar18;
    matrix->a4 = fVar20 + fVar17 + matrix->a4;
    matrix->b1 = fVar1 * matrix->b1 + fVar21 + fVar22 + fVar24;
    matrix->b2 = fVar2 * matrix->b2 + fVar6 + fVar22 + fVar24;
    matrix->b3 = fVar3 * matrix->b3 + fVar7 + fVar24;
    matrix->b4 = fVar7 + fVar22 + matrix->b4;
    matrix->c1 = fVar1 * matrix->c1 + fVar19 + fVar9 + fVar10;
    matrix->c2 = fVar2 * matrix->c2 + fVar8 + fVar9 + fVar10;
    matrix->c3 = fVar3 * matrix->c3 + fVar4 + fVar10;
    matrix->c4 = fVar4 + fVar9 + matrix->c4;
    matrix->d1 = fVar1 * matrix->d1 + fVar13 + fVar14 + fVar15;
    matrix->d2 = fVar2 * matrix->d2 + fVar11 + fVar14 + fVar15;
    matrix->d3 = fVar3 * matrix->d3 + fVar12 + fVar15;
  }
  matrix->d4 = fVar16;
  return;
}

Assistant:

static void GetNodeTransform(aiMatrix4x4& matrix, const glTF2::Node& node) {
    if (node.matrix.isPresent) {
        CopyValue(node.matrix.value, matrix);
    }
    else {
        if (node.translation.isPresent) {
            aiVector3D trans;
            CopyValue(node.translation.value, trans);
            aiMatrix4x4 t;
            aiMatrix4x4::Translation(trans, t);
            matrix = matrix * t;
        }

        if (node.rotation.isPresent) {
            aiQuaternion rot;
            CopyValue(node.rotation.value, rot);
            matrix = matrix * aiMatrix4x4(rot.GetMatrix());
        }

        if (node.scale.isPresent) {
            aiVector3D scal(1.f);
            CopyValue(node.scale.value, scal);
            aiMatrix4x4 s;
            aiMatrix4x4::Scaling(scal, s);
            matrix = matrix * s;
        }
    }
}